

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_vfs_register(sqlite3_vfs *pVfs,int makeDflt)

{
  sqlite3_mutex *p;
  int rc;
  sqlite3_mutex *mutex;
  int makeDflt_local;
  sqlite3_vfs *pVfs_local;
  
  pVfs_local._4_4_ = sqlite3_initialize();
  if (pVfs_local._4_4_ == 0) {
    p = sqlite3MutexAlloc(2);
    sqlite3_mutex_enter(p);
    vfsUnlink(pVfs);
    if ((makeDflt == 0) && (vfsList != (sqlite3_vfs *)0x0)) {
      pVfs->pNext = vfsList->pNext;
      vfsList->pNext = pVfs;
    }
    else {
      pVfs->pNext = vfsList;
      vfsList = pVfs;
    }
    sqlite3_mutex_leave(p);
    pVfs_local._4_4_ = 0;
  }
  return pVfs_local._4_4_;
}

Assistant:

SQLITE_API int sqlite3_vfs_register(sqlite3_vfs *pVfs, int makeDflt){
  MUTEX_LOGIC(sqlite3_mutex *mutex;)
#ifndef SQLITE_OMIT_AUTOINIT
  int rc = sqlite3_initialize();
  if( rc ) return rc;
#endif
#ifdef SQLITE_ENABLE_API_ARMOR
  if( pVfs==0 ) return SQLITE_MISUSE_BKPT;
#endif

  MUTEX_LOGIC( mutex = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MAIN); )
  sqlite3_mutex_enter(mutex);
  vfsUnlink(pVfs);
  if( makeDflt || vfsList==0 ){
    pVfs->pNext = vfsList;
    vfsList = pVfs;
  }else{
    pVfs->pNext = vfsList->pNext;
    vfsList->pNext = pVfs;
  }
  assert(vfsList);
  sqlite3_mutex_leave(mutex);
  return SQLITE_OK;
}